

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O2

char * Aig_MmStepEntryFetch(Aig_MmStep_t *p,int nBytes)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  
  if (nBytes == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (nBytes <= p->nMapSize) {
      pcVar2 = Aig_MmFixedEntryFetch(p->pMap[nBytes]);
      return pcVar2;
    }
    iVar3 = p->nChunks;
    if (iVar3 == p->nChunksAlloc) {
      p->nChunksAlloc = iVar3 * 2;
      if (p->pChunks == (char **)0x0) {
        ppcVar1 = (char **)malloc((long)iVar3 << 4);
      }
      else {
        ppcVar1 = (char **)realloc(p->pChunks,(long)iVar3 << 4);
        iVar3 = p->nChunks;
      }
      p->pChunks = ppcVar1;
    }
    else {
      ppcVar1 = p->pChunks;
    }
    pcVar2 = (char *)malloc((long)nBytes);
    p->nChunks = iVar3 + 1;
    ppcVar1[iVar3] = pcVar2;
    pcVar2 = p->pChunks[iVar3];
  }
  return pcVar2;
}

Assistant:

char * Aig_MmStepEntryFetch( Aig_MmStep_t * p, int nBytes )
{
    if ( nBytes == 0 )
        return NULL;
#ifdef ABC_MEMALIGN
    // extend size to max alignment
    nBytes += (ABC_MEMALIGN - nBytes % ABC_MEMALIGN) % ABC_MEMALIGN;
#endif
    if ( nBytes > p->nMapSize )
    {
        if ( p->nChunks == p->nChunksAlloc )
        {
            p->nChunksAlloc *= 2;
            p->pChunks = ABC_REALLOC( char *, p->pChunks, p->nChunksAlloc ); 
        }
        p->pChunks[ p->nChunks++ ] = ABC_ALLOC( char, nBytes );
        return p->pChunks[p->nChunks-1];
    }
    return Aig_MmFixedEntryFetch( p->pMap[nBytes] );
}